

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall
QPDFWriter::writeObjectStreamOffsets
          (QPDFWriter *this,vector<long_long,_std::allocator<long_long>_> *offsets,int first_obj)

{
  bool bVar1;
  string_view sVar2;
  string_view local_100;
  string local_f0;
  string_view local_d0;
  string_view local_c0;
  string_view local_b0;
  string_view local_a0;
  longlong *local_90;
  longlong *offset;
  iterator __end1;
  iterator __begin1;
  vector<long_long,_std::allocator<long_long>_> *__range1;
  string local_60;
  undefined1 local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> id;
  bool is_first;
  int first_obj_local;
  vector<long_long,_std::allocator<long_long>_> *offsets_local;
  QPDFWriter *this_local;
  
  id.field_2._12_4_ = first_obj;
  if (0 < first_obj) {
    id.field_2._M_local_buf[0xb] = '\x01';
    std::__cxx11::to_string(&local_60,first_obj);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_60,' ');
    std::__cxx11::string::~string((string *)&local_60);
    __end1 = std::vector<long_long,_std::allocator<long_long>_>::begin(offsets);
    offset = (longlong *)std::vector<long_long,_std::allocator<long_long>_>::end(offsets);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                                  *)&offset);
      if (!bVar1) break;
      local_90 = __gnu_cxx::
                 __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                 ::operator*(&__end1);
      if ((id.field_2._M_local_buf[0xb] & 1U) == 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a0,"\n");
        writeStringQDF(this,local_a0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b0," ");
        writeStringNoQDF(this,local_b0);
      }
      else {
        id.field_2._M_local_buf[0xb] = '\0';
      }
      sVar2 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40);
      local_c0 = sVar2;
      writeString(this,sVar2);
      ::qpdf::util::increment((string *)local_40,1);
      std::__cxx11::to_string(&local_f0,*local_90);
      sVar2 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_f0);
      local_d0 = sVar2;
      writeString(this,sVar2);
      std::__cxx11::string::~string((string *)&local_f0);
      __gnu_cxx::__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
      ::operator++(&__end1);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_100,"\n");
    writeString(this,local_100);
    std::__cxx11::string::~string((string *)local_40);
    return;
  }
  __assert_fail("first_obj > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFWriter.cc"
                ,0x65c,
                "void QPDFWriter::writeObjectStreamOffsets(std::vector<qpdf_offset_t> &, int)");
}

Assistant:

void
QPDFWriter::writeObjectStreamOffsets(std::vector<qpdf_offset_t>& offsets, int first_obj)
{
    qpdf_assert_debug(first_obj > 0);
    bool is_first = true;
    auto id = std::to_string(first_obj) + ' ';
    for (auto& offset: offsets) {
        if (is_first) {
            is_first = false;
        } else {
            writeStringQDF("\n");
            writeStringNoQDF(" ");
        }
        writeString(id);
        util::increment(id, 1);
        writeString(std::to_string(offset));
    }
    writeString("\n");
}